

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

value_type
pugi::impl::anon_unknown_0::utf8_decoder::process<pugi::impl::(anonymous_namespace)::utf32_writer>
          (uint *data,ulong size,value_type result)

{
  byte *pbVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  long lVar8;
  long lVar9;
  
LAB_00110cc7:
  do {
    puVar7 = data;
    lVar9 = 3;
    lVar8 = 0;
    while( true ) {
      uVar2 = size + lVar8;
      if (uVar2 == 0) {
        return result;
      }
      bVar3 = *(byte *)((long)puVar7 + lVar9 + -3);
      uVar6 = (uint)bVar3;
      if (-1 < (char)bVar3) {
        *result = uVar6;
        size = (size - 1) + lVar8;
        result = result + 1;
        data = (uint *)((long)puVar7 + (1 - lVar8));
        if ((size < 4) || ((((int)puVar7 - (int)lVar8) + 1U & 3) != 0)) goto LAB_00110cc7;
        goto LAB_00110deb;
      }
      if (((uVar2 != 1) && ((uVar6 & 0xffffffe0) == 0xc0)) &&
         (bVar4 = *(byte *)((long)puVar7 + lVar9 + -2), (bVar4 & 0xc0) == 0x80)) {
        size = (size - 2) + lVar8;
        *result = bVar4 & 0x3f | (uVar6 & 0x1f) << 6;
        result = result + 1;
        data = (uint *)((long)puVar7 + (2 - lVar8));
        goto LAB_00110cc7;
      }
      if (((2 < uVar2) && ((uVar6 & 0xfffffff0) == 0xe0)) &&
         ((bVar4 = *(byte *)((long)puVar7 + lVar9 + -2), (bVar4 & 0xc0) == 0x80 &&
          (uVar5 = (uint)*(byte *)((long)puVar7 + lVar9 + -1), (uVar5 & 0xffffffc0) == 0x80)))) {
        size = (size - 3) + lVar8;
        *result = uVar5 & 0x3f | (bVar4 & 0x3f) << 6 | (bVar3 & 0xf) << 0xc;
        result = result + 1;
        data = (uint *)((long)puVar7 + (3 - lVar8));
        goto LAB_00110cc7;
      }
      if (((3 < uVar2) && ((bVar3 & 0xf8) == 0xf0)) &&
         ((uVar5 = (uint)*(byte *)((long)puVar7 + lVar9 + -2), (uVar5 & 0xffffffc0) == 0x80 &&
          ((bVar3 = *(byte *)((long)puVar7 + lVar9 + -1), (bVar3 & 0xc0) == 0x80 &&
           ((*(byte *)((long)puVar7 + lVar9) & 0xffffffc0) == 0x80)))))) break;
      lVar8 = lVar8 + -1;
      lVar9 = lVar9 + 1;
    }
    size = (size - 4) + lVar8;
    *result = *(byte *)((long)puVar7 + lVar9) & 0x3f |
              (bVar3 & 0x3f) << 6 | (uVar5 & 0x3f) << 0xc | (uVar6 & 7) << 0x12;
    result = result + 1;
    data = (uint *)((long)puVar7 + (4 - lVar8));
  } while( true );
  while( true ) {
    size = size - 4;
    *result = *data & 0x7f;
    result[1] = (uint)*(byte *)((long)data + 1);
    result[2] = (uint)*(byte *)((long)data + 2);
    pbVar1 = (byte *)((long)data + 3);
    data = data + 1;
    result[3] = (uint)*pbVar1;
    result = result + 4;
    if (size < 4) break;
LAB_00110deb:
    if ((*data & 0x80808080) != 0) break;
  }
  goto LAB_00110cc7;
}

Assistant:

static inline typename Traits::value_type process(const uint8_t* data, size_t size, typename Traits::value_type result, Traits)
		{
			const uint8_t utf8_byte_mask = 0x3f;

			while (size)
			{
				uint8_t lead = *data;

				// 0xxxxxxx -> U+0000..U+007F
				if (lead < 0x80)
				{
					result = Traits::low(result, lead);
					data += 1;
					size -= 1;

					// process aligned single-byte (ascii) blocks
					if ((reinterpret_cast<uintptr_t>(data) & 3) == 0)
					{
						// round-trip through void* to silence 'cast increases required alignment of target type' warnings
						while (size >= 4 && (*static_cast<const uint32_t*>(static_cast<const void*>(data)) & 0x80808080) == 0)
						{
							result = Traits::low(result, data[0]);
							result = Traits::low(result, data[1]);
							result = Traits::low(result, data[2]);
							result = Traits::low(result, data[3]);
							data += 4;
							size -= 4;
						}
					}
				}
				// 110xxxxx -> U+0080..U+07FF
				else if (static_cast<unsigned int>(lead - 0xC0) < 0x20 && size >= 2 && (data[1] & 0xc0) == 0x80)
				{
					result = Traits::low(result, ((lead & ~0xC0) << 6) | (data[1] & utf8_byte_mask));
					data += 2;
					size -= 2;
				}
				// 1110xxxx -> U+0800-U+FFFF
				else if (static_cast<unsigned int>(lead - 0xE0) < 0x10 && size >= 3 && (data[1] & 0xc0) == 0x80 && (data[2] & 0xc0) == 0x80)
				{
					result = Traits::low(result, ((lead & ~0xE0) << 12) | ((data[1] & utf8_byte_mask) << 6) | (data[2] & utf8_byte_mask));
					data += 3;
					size -= 3;
				}
				// 11110xxx -> U+10000..U+10FFFF
				else if (static_cast<unsigned int>(lead - 0xF0) < 0x08 && size >= 4 && (data[1] & 0xc0) == 0x80 && (data[2] & 0xc0) == 0x80 && (data[3] & 0xc0) == 0x80)
				{
					result = Traits::high(result, ((lead & ~0xF0) << 18) | ((data[1] & utf8_byte_mask) << 12) | ((data[2] & utf8_byte_mask) << 6) | (data[3] & utf8_byte_mask));
					data += 4;
					size -= 4;
				}
				// 10xxxxxx or 11111xxx -> invalid
				else
				{
					data += 1;
					size -= 1;
				}
			}

			return result;
		}